

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int apply_remote_transport_params(quicly_conn_t *conn)

{
  long in_RDI;
  int ret;
  int local_4;
  
  *(undefined8 *)(in_RDI + 0x690) = *(undefined8 *)(in_RDI + 0x2a8);
  local_4 = update_max_streams((st_quicly_max_streams_t *)(in_RDI + 0x6a0),
                               *(uint64_t *)(in_RDI + 0x2c0));
  if ((local_4 == 0) &&
     (local_4 = update_max_streams((st_quicly_max_streams_t *)(in_RDI + 0x6c8),
                                   *(uint64_t *)(in_RDI + 0x2b8)), local_4 == 0)) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int apply_remote_transport_params(quicly_conn_t *conn)
{
    int ret;

    conn->egress.max_data.permitted = conn->super.remote.transport_params.max_data;
    if ((ret = update_max_streams(&conn->egress.max_streams.uni, conn->super.remote.transport_params.max_streams_uni)) != 0)
        return ret;
    if ((ret = update_max_streams(&conn->egress.max_streams.bidi, conn->super.remote.transport_params.max_streams_bidi)) != 0)
        return ret;

    return 0;
}